

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O0

void __thiscall
irr::scene::CSceneManager::getSceneNodesFromType
          (CSceneManager *this,ESCENE_NODE_TYPE type,array<irr::scene::ISceneNode_*> *outNodes,
          ISceneNode *start)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  reference ppIVar4;
  ISceneNode *in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  long *in_RDI;
  const_iterator it;
  ISceneNodeList *list;
  list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
  *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  _Self local_38;
  _Self local_30;
  list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_> *local_28;
  ISceneNode *local_20;
  undefined8 local_18;
  int local_c;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  if (in_RCX == (ISceneNode *)0x0) {
    local_20 = (ISceneNode *)(**(code **)(*in_RDI + 0x48))();
  }
  iVar3 = (*local_20->_vptr_ISceneNode[0x21])();
  if ((iVar3 == local_c) || (local_c == 0x5f796e61)) {
    core::array<irr::scene::ISceneNode_*>::push_back
              ((array<irr::scene::ISceneNode_*> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (ISceneNode **)in_stack_ffffffffffffffa8);
  }
  local_28 = ISceneNode::getChildren_abi_cxx11_(local_20);
  local_30._M_node =
       (_List_node_base *)
       ::std::__cxx11::list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>::
       begin(in_stack_ffffffffffffffa8);
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         ::std::__cxx11::list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>::
         end(in_stack_ffffffffffffffa8);
    bVar2 = ::std::operator!=(&local_30,&local_38);
    uVar1 = local_18;
    if (!bVar2) break;
    iVar3 = local_c;
    ppIVar4 = ::std::_List_const_iterator<irr::scene::ISceneNode_*>::operator*
                        ((_List_const_iterator<irr::scene::ISceneNode_*> *)0x2fbea5);
    (**(code **)(*in_RDI + 0x68))(in_RDI,iVar3,uVar1,*ppIVar4);
    ::std::_List_const_iterator<irr::scene::ISceneNode_*>::operator++(&local_30);
  }
  return;
}

Assistant:

void CSceneManager::getSceneNodesFromType(ESCENE_NODE_TYPE type, core::array<scene::ISceneNode *> &outNodes, ISceneNode *start)
{
	if (start == 0)
		start = getRootSceneNode();

	if (start->getType() == type || ESNT_ANY == type)
		outNodes.push_back(start);

	const ISceneNodeList &list = start->getChildren();
	ISceneNodeList::const_iterator it = list.begin();

	for (; it != list.end(); ++it) {
		getSceneNodesFromType(type, outNodes, *it);
	}
}